

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O1

bool __thiscall DHUDMessageFadeOut::Tick(DHUDMessageFadeOut *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (this->super_DHUDMessage).Tics + 1;
  (this->super_DHUDMessage).Tics = iVar3;
  if (((this->super_DHUDMessage).State == 1) &&
     (iVar1 = (this->super_DHUDMessage).HoldTics, iVar1 <= iVar3)) {
    (this->super_DHUDMessage).State = 2;
    (this->super_DHUDMessage).Tics = iVar3 - iVar1;
  }
  if (((this->super_DHUDMessage).State != 2) ||
     (bVar2 = true, (this->super_DHUDMessage).Tics < this->FadeOutTics)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DHUDMessageFadeOut::Tick ()
{
	Tics++;
	if (State == 1 && HoldTics <= Tics)
	{
		State++;
		Tics -= HoldTics;
	}
	if (State == 2 && FadeOutTics <= Tics)
	{
		return true;
	}
	return false;
}